

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffinit(fitsfile **fptr,char *name,int *status)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FITSfile *pFVar5;
  LONGLONG *pLVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  int handle;
  int local_8d0;
  int driver;
  fitsfile *local_8c8;
  char *local_8c0;
  char urltype [20];
  char compspec [80];
  char tmplfile [1025];
  char outfile [1025];
  
  *fptr = (fitsfile *)0x0;
  iVar2 = *status;
  if (0 < iVar2) {
    return iVar2;
  }
  if (iVar2 == -0x6a) {
    *status = 0;
  }
  if (need_to_initialize != 0) {
    iVar3 = fits_init_cfitsio();
    *status = iVar3;
    if (0 < iVar3) {
      return iVar3;
    }
  }
  for (; cVar1 = *name, cVar1 == ' '; name = name + 1) {
  }
  if (cVar1 == '\0') {
    name = "Name of file to create is blank. (ffinit)";
LAB_001102fb:
    ffpmsg(name);
LAB_00110300:
    *status = 0x69;
    iVar2 = 0x69;
  }
  else {
    if (iVar2 != -0x6a) {
      uVar9 = (uint)(cVar1 == '!');
      name = name + uVar9;
      ffourl(name,urltype,outfile,tmplfile,compspec,status);
      if (*status < 1) goto LAB_00110398;
      pcVar7 = "could not parse the output filename: (ffinit)";
LAB_001103b4:
      ffpmsg(pcVar7);
      ffpmsg(name);
LAB_001103c1:
      return *status;
    }
    sVar4 = strlen(name);
    if (0x400 < sVar4) {
      name = "Filename is too long. (ffinit)";
      goto LAB_001102fb;
    }
    strcpy(outfile,name);
    builtin_strncpy(urltype,"file://",8);
    uVar9 = 0;
    tmplfile[0] = '\0';
    compspec[0] = '\0';
LAB_00110398:
    iVar3 = urltype2driver(urltype,&driver);
    *status = iVar3;
    if (iVar3 != 0) {
      pcVar7 = "could not find driver for this file: (ffinit)";
      goto LAB_001103b4;
    }
    local_8d0 = driver;
    lVar8 = (long)driver;
    if ((uVar9 != 0) && (driverTable[lVar8].remove != (_func_int_char_ptr *)0x0)) {
      (*driverTable[lVar8].remove)(outfile);
    }
    if (driverTable[lVar8].create == (_func_int_char_ptr_int_ptr *)0x0) {
      ffpmsg("cannot create a new file of this type: (ffinit)");
      goto LAB_001102fb;
    }
    iVar3 = (*driverTable[lVar8].create)(outfile,&handle);
    *status = iVar3;
    if (iVar3 != 0) {
      pcVar7 = "failed to create new file (already exists?):";
      goto LAB_001103b4;
    }
    local_8c8 = (fitsfile *)calloc(1,0x10);
    *fptr = local_8c8;
    if (local_8c8 == (fitsfile *)0x0) {
      (*driverTable[lVar8].close)(handle);
      ffpmsg("failed to allocate structure for following file: (ffopen)");
      ffpmsg(name);
    }
    else {
      pFVar5 = (FITSfile *)calloc(1,0x7e8);
      local_8c8->Fptr = pFVar5;
      if (pFVar5 == (FITSfile *)0x0) {
        (*driverTable[lVar8].close)(handle);
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(name);
      }
      else {
        sVar4 = strlen(name);
        uVar9 = (int)sVar4 + 1;
        sVar4 = 0x20;
        if (0x20 < (int)uVar9) {
          sVar4 = (size_t)uVar9;
        }
        local_8c0 = (char *)malloc(sVar4);
        pFVar5->filename = local_8c0;
        if (local_8c0 == (char *)0x0) {
          (*driverTable[lVar8].close)(handle);
          ffpmsg("failed to allocate memory for filename: (ffinit)");
          ffpmsg(name);
          free((*fptr)->Fptr);
          free(*fptr);
          *fptr = (fitsfile *)0x0;
          goto LAB_00110300;
        }
        pLVar6 = (LONGLONG *)calloc(0x3e9,8);
        pFVar5->headstart = pLVar6;
        if (pLVar6 == (LONGLONG *)0x0) {
          (*driverTable[lVar8].close)(handle);
          ffpmsg("failed to allocate memory for headstart array: (ffinit)");
          ffpmsg(name);
        }
        else {
          pcVar7 = (char *)calloc(0x28,0xb40);
          pFVar5->iobuffer = pcVar7;
          if (pcVar7 != (char *)0x0) {
            for (lVar8 = 0x1d2; lVar8 != 0x1fa; lVar8 = lVar8 + 1) {
              (&pFVar5->filehandle)[lVar8] = (int)lVar8 + -0x1d2;
              *(undefined8 *)((long)pFVar5 + lVar8 * 8 + -0x928) = 0xffffffffffffffff;
            }
            pFVar5->MAXHDU = 1000;
            pFVar5->filehandle = handle;
            pFVar5->driver = local_8d0;
            strcpy(local_8c0,name);
            pFVar5->filesize = 0;
            pFVar5->logfilesize = 0;
            pFVar5->writemode = 1;
            pFVar5->datastart = -1;
            pFVar5->curbuf = -1;
            pFVar5->open_count = 1;
            pFVar5->validcode = 0x22b;
            pFVar5->noextsyntax = (uint)(iVar2 == -0x6a);
            ffldrc(local_8c8,0,1,status);
            fits_store_Fptr((*fptr)->Fptr,status);
            if (tmplfile[0] != '\0') {
              ffoptplt(*fptr,tmplfile,status);
            }
            if (compspec[0] != '\0') {
              ffparsecompspec(*fptr,compspec,status);
            }
            goto LAB_001103c1;
          }
          (*driverTable[lVar8].close)(handle);
          ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
          ffpmsg(name);
          free((*fptr)->Fptr->headstart);
        }
        free((*fptr)->Fptr->filename);
        free((*fptr)->Fptr);
      }
      free(*fptr);
      *fptr = (fitsfile *)0x0;
    }
    *status = 0x71;
    iVar2 = 0x71;
  }
  return iVar2;
}

Assistant:

int ffinit(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *name,     /* I - name of file to create              */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file.
*/
{
    int ii, driver, slen, clobber = 0;
    char *url;
    char urltype[MAX_PREFIX_LEN], outfile[FLEN_FILENAME];
    char tmplfile[FLEN_FILENAME], compspec[80];
    int handle, create_disk_file = 0;

    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if (*status == CREATE_DISK_FILE)
    {
       create_disk_file = 1;
       *status = 0;
    }

    if (need_to_initialize)  {          /* this is called only once */
        *status = fits_init_cfitsio();
    }

    if (*status > 0)
        return(*status);

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the filename */
        url++;

    if (*url == '\0')
    {
        ffpmsg("Name of file to create is blank. (ffinit)");
        return(*status = FILE_NOT_CREATED);
    }

    if (create_disk_file)
    {
       if (strlen(url) > FLEN_FILENAME - 1)
       {
           ffpmsg("Filename is too long. (ffinit)");
           return(*status = FILE_NOT_CREATED);
       }

       strcpy(outfile, url);
       strcpy(urltype, "file://");
       tmplfile[0] = '\0';
       compspec[0] = '\0';
    }
    else
    {
       
      /* check for clobber symbol, i.e,  overwrite existing file */
      if (*url == '!')
      {
          clobber = TRUE;
          url++;
      }
      else
          clobber = FALSE;

        /* parse the output file specification */
	/* this routine checks that the strings will not overflow */
      ffourl(url, urltype, outfile, tmplfile, compspec, status);

      if (*status > 0)
      {
        ffpmsg("could not parse the output filename: (ffinit)");
        ffpmsg(url);
        return(*status);
      }
    }
    
        /* find which driver corresponds to the urltype */
    *status = urltype2driver(urltype, &driver);

    if (*status)
    {
        ffpmsg("could not find driver for this file: (ffinit)");
        ffpmsg(url);
        return(*status);
    }

        /* delete pre-existing file, if asked to do so */
    if (clobber)
    {
        if (driverTable[driver].remove)
             (*driverTable[driver].remove)(outfile);
    }

        /* call appropriate driver to create the file */
    if (driverTable[driver].create)
    {

        FFLOCK;  /* lock this while searching for vacant handle */
        *status = (*driverTable[driver].create)(outfile, &handle);
        FFUNLOCK;

        if (*status)
        {
            ffpmsg("failed to create new file (already exists?):");
            ffpmsg(url);
            return(*status);
       }
    }
    else
    {
        ffpmsg("cannot create a new file of this type: (ffinit)");
        ffpmsg(url);
        return(*status = FILE_NOT_CREATED);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffinit)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = FILE_NOT_CREATED);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* store the file pointer */
    ((*fptr)->Fptr)->driver = driver;            /*  driver number         */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename    */
    ((*fptr)->Fptr)->filesize = 0;               /* physical file size     */
    ((*fptr)->Fptr)->logfilesize = 0;            /* logical file size      */
    ((*fptr)->Fptr)->writemode = 1;              /* read-write mode        */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data  */
    ((*fptr)->Fptr)->curbuf = -1;         /* undefined current IO buffer   */
    ((*fptr)->Fptr)->open_count = 1;      /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = create_disk_file; /* true if extended syntax is disabled */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    /* if template file was given, use it to define structure of new file */

    if (tmplfile[0])
        ffoptplt(*fptr, tmplfile, status);

    /* parse and save image compression specification, if given */
    if (compspec[0])
        ffparsecompspec(*fptr, compspec, status);

    return(*status);                       /* successful return */
}